

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElH1.cpp
# Opt level: O1

void __thiscall
TPZCompElH1<pzshape::TPZShapeCube>::SideShapeFunction
          (TPZCompElH1<pzshape::TPZShapeCube> *this,int side,TPZVec<double> *point,
          TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  TPZGeoEl *this_00;
  TPZGeoNode *pTVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  TPZManVector<int,_27> order;
  TPZManVector<long,_27> id;
  TPZManVector<int,_27> local_1b8;
  TPZManVector<long,_27> local_128;
  
  iVar1 = pztopology::TPZCube::NContainedSides(side);
  uVar2 = pztopology::TPZCube::NSideNodes(side);
  TPZManVector<long,_27>::TPZManVector(&local_128,(long)(int)uVar2);
  TPZManVector<int,_27>::TPZManVector(&local_1b8,(long)(int)(iVar1 - uVar2));
  this_00 = TPZCompEl::Reference((TPZCompEl *)this);
  if (0 < (int)uVar2) {
    uVar7 = 0;
    do {
      iVar3 = pztopology::TPZCube::SideNodeLocId(side,(int)uVar7);
      pTVar4 = TPZGeoEl::NodePtr(this_00,iVar3);
      local_128.super_TPZVec<long>.fStore[uVar7] = (long)pTVar4->fId;
      uVar7 = uVar7 + 1;
    } while (uVar2 != uVar7);
  }
  if ((int)uVar2 < iVar1) {
    lVar6 = 0;
    do {
      iVar3 = pztopology::TPZCube::ContainedSideLocId(side,uVar2 + (int)lVar6);
      lVar5 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeCube>).
                                     super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                     super_TPZCompEl + 0xa8))(this,iVar3);
      local_1b8.super_TPZVec<int>.fStore[lVar6] = (uint)*(byte *)(lVar5 + 0x14);
      lVar6 = lVar6 + 1;
    } while ((uVar2 - iVar1) + (int)lVar6 != 0);
  }
  pzshape::TPZShapeCube::SideShape
            (side,point,&local_128.super_TPZVec<long>,&local_1b8.super_TPZVec<int>,phi,dphi);
  if (local_1b8.super_TPZVec<int>.fStore == local_1b8.fExtAlloc) {
    local_1b8.super_TPZVec<int>.fStore = (int *)0x0;
  }
  local_1b8.super_TPZVec<int>.fNAlloc = 0;
  local_1b8.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
  if (local_1b8.super_TPZVec<int>.fStore != (int *)0x0) {
    operator_delete__(local_1b8.super_TPZVec<int>.fStore);
  }
  if (local_128.super_TPZVec<long>.fStore == local_128.fExtAlloc) {
    local_128.super_TPZVec<long>.fStore = (long *)0x0;
  }
  local_128.super_TPZVec<long>.fNAlloc = 0;
  local_128.super_TPZVec<long>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
  if (local_128.super_TPZVec<long>.fStore != (long *)0x0) {
    operator_delete__(local_128.super_TPZVec<long>.fStore);
  }
  return;
}

Assistant:

void TPZCompElH1<TSHAPE>::SideShapeFunction(int side,TPZVec<REAL> &point,TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi) {
	
	int nc = TSHAPE::NContainedSides(side);
	int nn = TSHAPE::NSideNodes(side);
	TPZManVector<int64_t,27> id(nn);
	TPZManVector<int,27> order(nc-nn);
	int n,c;
	TPZGeoEl *ref = this->Reference();
	for (n=0;n<nn;n++){
		int nodloc = TSHAPE::SideNodeLocId(side,n);
		id [n] = ref->NodePtr(nodloc)->Id();
	}
	for (c=nn;c<nc;c++){
		int conloc = TSHAPE::ContainedSideLocId(side,c);
        order[c-nn] = this->Connect(conloc).Order();
	}
	TSHAPE::SideShape(side, point, id, order, phi, dphi);
}